

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bidi_test.c
# Opt level: O1

char * extract_word(char **ptr)

{
  ushort **ppuVar1;
  byte bVar2;
  byte *pbVar3;
  byte *pbVar4;
  bool bVar5;
  
  pbVar3 = (byte *)*ptr;
  bVar2 = *pbVar3;
  if (bVar2 != 0) {
    ppuVar1 = __ctype_b_loc();
    do {
      if ((*(byte *)((long)*ppuVar1 + (ulong)bVar2 * 2 + 1) & 0x20) == 0) break;
      bVar2 = pbVar3[1];
      pbVar3 = pbVar3 + 1;
    } while (bVar2 != 0);
  }
  bVar2 = *pbVar3;
  bVar5 = (ulong)bVar2 == 0;
  pbVar4 = pbVar3;
  if (!bVar5) {
    ppuVar1 = __ctype_b_loc();
    bVar2 = *(byte *)((long)*ppuVar1 + (ulong)bVar2 * 2 + 1);
    while ((bVar2 & 0x20) == 0) {
      pbVar4 = pbVar4 + 1;
      bVar5 = (ulong)*pbVar4 == 0;
      if (bVar5) goto LAB_00101c04;
      bVar2 = *(byte *)((long)*ppuVar1 + (ulong)*pbVar4 * 2 + 1);
    }
    if (!bVar5) {
      *pbVar4 = 0;
      do {
        pbVar4 = pbVar4 + 1;
        bVar2 = *pbVar4;
        if ((ulong)bVar2 == 0) break;
        ppuVar1 = __ctype_b_loc();
      } while ((*(byte *)((long)*ppuVar1 + (ulong)bVar2 * 2 + 1) & 0x20) != 0);
    }
  }
LAB_00101c04:
  *ptr = (char *)pbVar4;
  return (char *)pbVar3;
}

Assistant:

static const char *extract_word(char **ptr)
{
    char *p = *ptr;
    while (*p && isspace((unsigned char)*p)) p++;

    char *start = p;
    while (*p && !isspace((unsigned char)*p)) p++;

    if (*p) {
        *p++ = '\0';
        while (*p && isspace((unsigned char)*p)) p++;
    }

    *ptr = p;
    return start;
}